

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O0

void __thiscall
chrono::ChCoordsys<double>::ArchiveIN(ChCoordsys<double> *this,ChArchiveIn *marchive)

{
  ChArchiveIn *pCVar1;
  char in_R8B;
  ChNameValue<chrono::ChQuaternion<double>_> local_58;
  ChNameValue<chrono::ChVector<double>_> local_30;
  ChArchiveIn *local_18;
  ChArchiveIn *marchive_local;
  ChCoordsys<double> *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveIn *)this;
  ChArchiveIn::VersionRead<chrono::ChCoordsys<double>>(marchive);
  pCVar1 = local_18;
  make_ChNameValue<chrono::ChVector<double>>
            (&local_30,(chrono *)"pos",(char *)this,(ChVector<double> *)0x0,in_R8B);
  ChArchiveIn::operator>>(pCVar1,&local_30);
  ChNameValue<chrono::ChVector<double>_>::~ChNameValue(&local_30);
  pCVar1 = local_18;
  make_ChNameValue<chrono::ChQuaternion<double>>
            (&local_58,(chrono *)"rot",(char *)&this->rot,(ChQuaternion<double> *)0x0,in_R8B);
  ChArchiveIn::operator>>(pCVar1,&local_58);
  ChNameValue<chrono::ChQuaternion<double>_>::~ChNameValue(&local_58);
  return;
}

Assistant:

void ArchiveIN(ChArchiveIn& marchive) {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<ChCoordsys<double>>();
        // stream in all member data
        marchive >> CHNVP(pos);
        marchive >> CHNVP(rot);
    }